

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O0

void __thiscall
spdlog::details::circular_q<spdlog::details::log_msg_buffer>::copy_moveable
          (circular_q<spdlog::details::log_msg_buffer> *this,
          circular_q<spdlog::details::log_msg_buffer> *other)

{
  undefined8 *in_RSI;
  vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_> *in_RDI;
  vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  *unaff_retaddr;
  
  (in_RDI->
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)*in_RSI;
  (in_RDI->
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RSI[1];
  (in_RDI->
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_RSI[2];
  in_RDI[1].
  super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_RSI[3];
  std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
  operator=(unaff_retaddr,in_RDI);
  *in_RSI = 0;
  in_RSI[2] = 0;
  in_RSI[1] = 0;
  in_RSI[3] = 0;
  return;
}

Assistant:

void copy_moveable(circular_q &&other) SPDLOG_NOEXCEPT
    {
        max_items_ = other.max_items_;
        head_ = other.head_;
        tail_ = other.tail_;
        overrun_counter_ = other.overrun_counter_;
        v_ = std::move(other.v_);

        // put &&other in disabled, but valid state
        other.max_items_ = 0;
        other.head_ = other.tail_ = 0;
        other.overrun_counter_ = 0;
    }